

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQChar * __thiscall SQSharedState::GetScratchPad(SQSharedState *this,SQInteger size)

{
  SQChar *pSVar1;
  SQUnsignedInteger SVar2;
  SQInteger newsize;
  SQInteger size_local;
  SQSharedState *this_local;
  
  if (0 < size) {
    if (this->_scratchpadsize < size) {
      SVar2 = size + (size >> 1);
      pSVar1 = (SQChar *)sq_vm_realloc(this->_scratchpad,this->_scratchpadsize,SVar2);
      this->_scratchpad = pSVar1;
      this->_scratchpadsize = SVar2;
    }
    else if (size * 0x20 <= this->_scratchpadsize) {
      SVar2 = this->_scratchpadsize >> 1;
      pSVar1 = (SQChar *)sq_vm_realloc(this->_scratchpad,this->_scratchpadsize,SVar2);
      this->_scratchpad = pSVar1;
      this->_scratchpadsize = SVar2;
    }
  }
  return this->_scratchpad;
}

Assistant:

SQChar* SQSharedState::GetScratchPad(SQInteger size)
{
    SQInteger newsize;
    if(size>0) {
        if(_scratchpadsize < size) {
            newsize = size + (size>>1);
            _scratchpad = (SQChar *)SQ_REALLOC(_scratchpad,_scratchpadsize,newsize);
            _scratchpadsize = newsize;

        }else if(_scratchpadsize >= (size<<5)) {
            newsize = _scratchpadsize >> 1;
            _scratchpad = (SQChar *)SQ_REALLOC(_scratchpad,_scratchpadsize,newsize);
            _scratchpadsize = newsize;
        }
    }
    return _scratchpad;
}